

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O2

void __thiscall GameTitle::drawBorder(GameTitle *this,Screen *screen,int color)

{
  int iVar1;
  int iVar2;
  uint x;
  int iVar3;
  int iVar4;
  bool bVar5;
  allocator local_1e9;
  ulong local_1e8;
  ulong local_1e0;
  string *local_1d8;
  string character;
  string startMessage;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Screen::clearScreen(screen);
  std::__cxx11::string::string((string *)&character," ",(allocator *)&startMessage);
  std::__cxx11::string::string((string *)&startMessage,"<Press Enter to Start Game>",&local_1e9);
  iVar1 = Screen::getScreenSizeY(screen);
  iVar1 = iVar1 / 2;
  iVar2 = Screen::getScreenSizeX(screen);
  iVar3 = (int)(this->title)._M_string_length;
  local_1d8 = (string *)&this->title;
  iVar4 = iVar3 / -2;
  std::__cxx11::string::string((string *)&local_150,local_1d8);
  x = iVar4 + iVar2 / 2;
  local_1e8 = (ulong)x;
  Screen::printString(screen,&local_150,iVar1,x);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_170,(string *)&character);
  Screen::printString(screen,&local_170,iVar1 + -1,iVar4 + iVar2 / 2 + -1);
  std::__cxx11::string::~string((string *)&local_170);
  Screen::refreshScreen(screen);
  usleep(0x5161);
  bVar5 = false;
  iVar4 = 0;
  while (iVar2 = (int)local_1e8 + iVar4, !bVar5) {
    std::__cxx11::string::string((string *)&local_50,(string *)&character);
    Screen::printString(screen,&local_50,iVar1 + -1,iVar2);
    std::__cxx11::string::~string((string *)&local_50);
    Screen::refreshScreen(screen);
    usleep(0x5161);
    bVar5 = iVar3 + -1 == iVar4;
    iVar4 = iVar4 + 1;
  }
  local_1e0 = 0xffffffffffffffff;
  bVar5 = false;
  while( true ) {
    iVar3 = iVar1 + (int)local_1e0;
    if (bVar5) break;
    std::__cxx11::string::string((string *)&local_70,local_1d8);
    Screen::printString(screen,&local_70,iVar1,(int)local_1e8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_130,(string *)&character);
    Screen::printString(screen,&local_130,iVar3,iVar2);
    std::__cxx11::string::~string((string *)&local_130);
    Screen::refreshScreen(screen);
    usleep(0x5161);
    bVar5 = (int)local_1e0 == 0;
    local_1e0 = (ulong)((int)local_1e0 + 1);
  }
  bVar5 = false;
  while (iVar2 = (int)local_1e8 + iVar4, !bVar5) {
    std::__cxx11::string::string((string *)&local_90,local_1d8);
    Screen::printString(screen,&local_90,iVar1,(int)local_1e8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_b0,(string *)&character);
    Screen::printString(screen,&local_b0,iVar3,iVar2);
    std::__cxx11::string::~string((string *)&local_b0);
    Screen::refreshScreen(screen);
    usleep(0x5161);
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
  }
  bVar5 = false;
  while (!bVar5) {
    std::__cxx11::string::string((string *)&local_d0,local_1d8);
    Screen::printString(screen,&local_d0,iVar1,(int)local_1e8);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_f0,(string *)&character);
    Screen::printString(screen,&local_f0,iVar1 + (int)local_1e0,iVar2);
    std::__cxx11::string::~string((string *)&local_f0);
    Screen::refreshScreen(screen);
    usleep(0x5161);
    iVar3 = (int)local_1e0;
    local_1e0 = (ulong)(iVar3 - 1);
    bVar5 = iVar3 == 0;
  }
  std::__cxx11::string::string((string *)&local_190,(string *)&startMessage);
  Screen::printString(screen,&local_190,iVar1 + 4,(int)local_1e8);
  std::__cxx11::string::~string((string *)&local_190);
  Screen::refreshScreen(screen);
  Screen::getInput_abi_cxx11_(&local_110,screen);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&startMessage);
  std::__cxx11::string::~string((string *)&character);
  return;
}

Assistant:

void GameTitle::drawBorder(Screen &screen, int color) {
    screen.clearScreen();
    std::string character = " ";
    std::string startMessage = "<Press Enter to Start Game>";

    // Calculate the text location
    int textStartLocation[2];
    textStartLocation[0] = screen.getScreenSizeY() / 2;
    textStartLocation[1] = (screen.getScreenSizeX() / 2) - (static_cast<int>(title.length()) / 2);

    // Calculate the border dimensions
    int borderHeight = 2;
    int borderWidth = static_cast<int>(title.length()) + 1;

    int borderStartLocation[2];
    int borderCursor[2];

    borderStartLocation[0] = borderCursor[0] = textStartLocation[0] - 1;
    borderStartLocation[1] = borderCursor[1] = textStartLocation[1] - 1;

    // Draw the border
    screen.printString(title, textStartLocation[0], textStartLocation[1]);
    screen.printString(character, borderStartLocation[0], borderStartLocation[1]);
    screen.refreshScreen();
    usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

    borderCursor[1]++;

    bool lineFinished = false;

    while(!lineFinished){
        // Print the border
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[1]++;

        if(borderCursor[1] == (borderStartLocation[1] + borderWidth)){
            lineFinished = true;
        }
    }

    lineFinished = false;
    while(!lineFinished){
        // Print the border
        screen.printString(title, textStartLocation[0], textStartLocation[1]);
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[0]++;

        if(borderCursor[0] == (borderStartLocation[0] + borderHeight)){
            lineFinished = true;
        }
    }

    lineFinished = false;
    while(!lineFinished){
        // Print the border
        screen.printString(title, textStartLocation[0], textStartLocation[1]);
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[1]--;

        if(borderCursor[1] == borderStartLocation[1]){
            lineFinished = true;
        }
    }

    lineFinished = false;
    while(!lineFinished){
        // Print the border
        screen.printString(title, textStartLocation[0], textStartLocation[1]);
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[0]--;

        if(borderCursor[0] == borderStartLocation[0]){
            lineFinished = true;
        }
    }

    screen.printString(startMessage, textStartLocation[0] + 4, textStartLocation[1]);
    screen.refreshScreen();

    screen.getInput();
}